

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O2

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  long *plVar1;
  long *plVar2;
  _Vector_impl_data *p_Var3;
  Config *pCVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pBVar10;
  uint *puVar11;
  Config *pCVar12;
  long lVar13;
  Node<float,_3UL,_32UL,_4UL> *pNVar14;
  pointer pBVar15;
  pointer puVar16;
  size_t i;
  ThreadPool *pTVar17;
  undefined1 auVar18 [16];
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__new_size;
  size_type __new_size_00;
  Config *end;
  Config *pCVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  Node<float,_3UL,_32UL,_4UL> *dst_node;
  ulong uVar23;
  long lVar24;
  _Any_data *__stat_loc;
  pointer *ppuVar25;
  undefined1 auVar26 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  anon_class_40_5_dabb3477 local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> prim_offsets;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_offsets;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  _Any_data local_148 [2];
  anon_class_16_2_cdc430d5 copy_node;
  undefined1 local_118 [192];
  Config local_58;
  
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&centers,((long)(mini_trees->
                             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(mini_trees->
                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x30,
             (allocator_type *)local_118);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&bboxes,((long)(mini_trees->
                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mini_trees->
                           super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x30,
             (allocator_type *)local_118);
  lVar21 = 0;
  uVar23 = 0;
  while (pBVar10 = (mini_trees->
                   super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
        uVar23 < (ulong)(((long)(mini_trees->
                                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10) / 0x30)
        ) {
    puVar11 = *(uint **)((long)&(pBVar10->nodes).
                                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                ._M_impl + lVar21 * 4);
    uVar23 = uVar23 + 1;
    uVar5 = puVar11[4];
    uVar20 = puVar11[5];
    auVar26 = vinsertps_avx(ZEXT416(*puVar11),ZEXT416(puVar11[2]),0x10);
    auVar18 = vinsertps_avx(ZEXT416(puVar11[1]),ZEXT416(puVar11[3]),0x10);
    uVar8 = vmovlps_avx(auVar26);
    *(undefined8 *)
     ((long)((bboxes.
              super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar21 * 2) = uVar8;
    *(uint *)((long)((bboxes.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar21 * 2 + -4) =
         uVar5;
    uVar8 = vmovlps_avx(auVar18);
    *(undefined8 *)
     ((long)((bboxes.
              super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar21 * 2) = uVar8;
    *(uint *)((long)((bboxes.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar21 * 2 + 8) =
         uVar20;
    fVar6 = *(float *)((long)((bboxes.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->max).values +
                      lVar21 * 2 + 8);
    uVar8 = *(undefined8 *)
             ((long)((bboxes.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar21 * 2);
    uVar9 = *(undefined8 *)
             ((long)((bboxes.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar21 * 2);
    fVar7 = *(float *)((long)((bboxes.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->max).values +
                      lVar21 * 2 + -4);
    auVar26._0_4_ = ((float)uVar9 + (float)uVar8) * 0.5;
    auVar26._4_4_ = ((float)((ulong)uVar9 >> 0x20) + (float)((ulong)uVar8 >> 0x20)) * 0.5;
    auVar26._8_8_ = 0;
    uVar8 = vmovlps_avx(auVar26);
    *(undefined8 *)
     ((long)(centers.
             super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->values + lVar21) = uVar8;
    *(float *)((long)(centers.
                      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->values + lVar21 + 8) =
         (fVar6 + fVar7) * 0.5;
    lVar21 = lVar21 + 0xc;
  }
  pCVar12 = this->config_;
  local_118._40_8_ = &local_58;
  local_58.sah.cost_ratio_ = (pCVar12->super_Config).sah.cost_ratio_;
  local_58.sah._20_4_ = *(undefined4 *)&(pCVar12->super_Config).sah.field_0x14;
  local_58.sah.log_cluster_size_ = (pCVar12->super_Config).sah.log_cluster_size_;
  local_58.sah.prim_offset_ = (pCVar12->super_Config).sah.prim_offset_;
  local_58.min_leaf_size = 1;
  local_58.max_leaf_size = 1;
  __new_size = (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)
               (((long)bboxes.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)bboxes.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_1b8.copy_node =
       (anon_class_16_2_cdc430d5 *)
       (((long)centers.
               super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)centers.
              super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  local_1b8.mini_trees =
       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        *)centers.
          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start;
  local_118._0_8_ = &PTR___cxa_pure_virtual_00118cf8;
  local_118._8_8_ =
       bboxes.
       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_118._24_8_ =
       centers.
       super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_118._16_8_ = __new_size;
  local_118._32_8_ = local_1b8.copy_node;
  if (__new_size == (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_1b8.copy_node) {
    local_118._0_8_ = &PTR_get_prim_ids_00118d18;
    local_118._48_8_ = (Config *)0x0;
    local_118._56_4_ = 0;
    local_118._64_8_ = (_Bit_type *)0x0;
    local_118._72_4_ = 0;
    local_118._80_40_ = SUB6440(ZEXT864(0) << 0x20,0);
    local_118._120_24_ = SUB6424(ZEXT864(0) << 0x20,0);
    local_118._144_40_ = (undefined1  [40])0x0;
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(local_118 + 0x30),(size_type)__new_size,false
              );
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)(local_118 + 0x58),(size_type)__new_size);
    for (local_148[0]._0_8_ = (code *)0x0; (ulong)local_148[0]._0_8_ < (code *)0x3;
        local_148[0]._0_8_ = local_148[0]._M_unused._M_function_pointer + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (local_118 + local_148[0]._0_8_ * 0x18 + 0x70),(size_type)__new_size);
      lVar24 = 0;
      lVar21 = *(long *)(local_118 + local_148[0]._M_unused._M_member_pointer * 0x18 + 0x70);
      lVar13 = *(long *)(local_118 + local_148[0]._M_unused._M_member_pointer * 0x18 + 0x78);
      for (lVar22 = 0; lVar21 + lVar22 != lVar13; lVar22 = lVar22 + 8) {
        *(long *)(lVar21 + lVar24 * 8) = lVar24;
        lVar24 = lVar24 + 1;
      }
      __comp._M_comp.axis = (size_t *)local_148;
      __comp._M_comp.centers =
           (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)&local_1b8;
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)
                    (local_118 + local_148[0]._M_unused._M_member_pointer * 0x18 + 0x70),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )*(unsigned_long **)
                    (local_118 + local_148[0]._M_unused._M_member_pointer * 0x18 + 0x78),__comp);
    }
    TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
              (__return_storage_ptr__,
               (TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_118);
    SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~SweepSahBuilder
              ((SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)local_118);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&node_offsets,
               ((long)(mini_trees->
                      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x30,(allocator_type *)local_118)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&prim_offsets,
               ((long)(mini_trees->
                      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x30,(allocator_type *)local_118)
    ;
    dst_node = (__return_storage_ptr__->nodes).
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pNVar14 = (__return_storage_ptr__->nodes).
              super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __stat_loc = (_Any_data *)0x0;
    __new_size_00 = ((long)pNVar14 - (long)dst_node) / 0x1c;
    pBVar10 = (mini_trees->
              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pBVar15 = (mini_trees->
              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    ppuVar25 = (pointer *)
               ((long)&(pBVar10->prim_ids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    for (lVar21 = 0; ((long)pBVar15 - (long)pBVar10) / 0x30 != lVar21; lVar21 = lVar21 + 1) {
      node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] = __new_size_00 - 1;
      prim_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] = (unsigned_long)__stat_loc;
      plVar1 = (long *)(ppuVar25 + -3);
      puVar16 = *ppuVar25;
      plVar2 = (long *)(ppuVar25 + -4);
      p_Var3 = (_Vector_impl_data *)(ppuVar25 + -1);
      ppuVar25 = ppuVar25 + 6;
      __stat_loc = (_Any_data *)((long)__stat_loc + ((long)puVar16 - (long)p_Var3->_M_start >> 3));
      __new_size_00 = (__new_size_00 - 1) + (*plVar1 - *plVar2) / 0x1c;
    }
    copy_node.prim_offsets = &prim_offsets;
    copy_node.node_offsets = &node_offsets;
    do {
      if (dst_node == pNVar14) {
        std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::resize(&__return_storage_ptr__->nodes,__new_size_00);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&__return_storage_ptr__->prim_ids,(size_type)__stat_loc);
        end = (Config *)
              (((long)(mini_trees->
                      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x30);
        local_1b8.copy_node = &copy_node;
        local_1b8.node_offsets = &node_offsets;
        local_1b8.prim_offsets = &prim_offsets;
        local_1b8.mini_trees = mini_trees;
        local_1b8.bvh = __return_storage_ptr__;
        if (end < (Config *)(this->executor_).parallel_threshold) {
          build_top_bvh::anon_class_40_5_dabb3477::operator()(&local_1b8,0,(size_t)end);
        }
        else {
          pTVar17 = (this->executor_).thread_pool;
          uVar23 = (ulong)end /
                   (ulong)((long)(pTVar17->threads_).
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar17->threads_).
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3);
          pCVar19 = (Config *)0x0;
          while (pCVar19 < end) {
            pCVar4 = (Config *)((long)&(pCVar19->sah).log_cluster_size_ + uVar23 + (uVar23 == 0));
            local_118._48_8_ = end;
            if (pCVar4 < end) {
              local_118._48_8_ = pCVar4;
            }
            pTVar17 = (this->executor_).thread_pool;
            local_118._32_8_ = local_1b8.prim_offsets;
            local_118._0_8_ = local_1b8.mini_trees;
            local_118._8_8_ = local_1b8.copy_node;
            local_118._16_8_ = local_1b8.bvh;
            local_118._24_8_ = local_1b8.node_offsets;
            local_118._40_8_ = pCVar19;
            std::function<void(unsigned_long)>::
            function<bvh::v2::ParallelExecutor::for_each<bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::build_top_bvh(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&)::_lambda(unsigned_long,unsigned_long)_1_>(unsigned_long,unsigned_long,bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::build_top_bvh(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&)::_lambda(unsigned_long,unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,void>
                      ((function<void(unsigned_long)> *)local_148[0]._M_pod_data,
                       (anon_class_56_3_c7f13407 *)local_118);
            __stat_loc = local_148;
            ThreadPool::push(pTVar17,(Task *)local_148);
            std::_Function_base::~_Function_base((_Function_base *)local_148);
            pCVar19 = pCVar4;
          }
          ThreadPool::wait((this->executor_).thread_pool,__stat_loc);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&prim_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::
        ~_Vector_base(&bboxes.
                       super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                     );
        std::_Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
        ~_Vector_base(&centers.
                       super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                     );
        return __return_storage_ptr__;
      }
      uVar5 = (dst_node->index).value;
      uVar20 = uVar5 & 0xf;
      if (uVar20 != 0) {
        if (uVar20 != 1) {
          __assert_fail("node.index.prim_count() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                        ,0x11d,
                        "Bvh<Node> bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::build_top_bvh(std::vector<Bvh<Node>> &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                       );
        }
        i = (__return_storage_ptr__->prim_ids).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 >> 4];
        build_top_bvh::anon_class_16_2_cdc430d5::operator()
                  (&copy_node,i,dst_node,
                   *(Node<float,_3UL,_32UL,_4UL> **)
                    &(mini_trees->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[i].nodes.
                     super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                     ._M_impl);
      }
      dst_node = dst_node + 1;
    } while( true );
  }
  __assert_fail("bboxes.size() == centers.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                ,0x3f,
                "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
               );
}

Assistant:

Bvh<Node> build_top_bvh(std::vector<Bvh<Node>>& mini_trees) {
        // Build a BVH using the mini trees as leaves
        std::vector<Vec> centers(mini_trees.size());
        std::vector<BBox> bboxes(mini_trees.size());
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            bboxes[i] = mini_trees[i].get_root().get_bbox();
            centers[i] = bboxes[i].get_center();
        }

        typename SweepSahBuilder<Node>::Config config = config_;
        config.max_leaf_size = config.min_leaf_size = 1; // Needs to have only one mini-tree in each leaf
        auto bvh = SweepSahBuilder<Node>::build(bboxes, centers, config);

        // Compute the offsets to apply to primitive and node indices
        std::vector<size_t> node_offsets(mini_trees.size());
        std::vector<size_t> prim_offsets(mini_trees.size());
        size_t node_count = bvh.nodes.size();
        size_t prim_count = 0;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            node_offsets[i] = node_count - 1; // Skip root node
            prim_offsets[i] = prim_count;
            node_count += mini_trees[i].nodes.size() - 1; // idem
            prim_count += mini_trees[i].prim_ids.size();
        }

        // Helper function to copy and fix the child/primitive index of a node
        auto copy_node = [&] (size_t i, Node& dst_node, const Node& src_node) {
            dst_node = src_node;
            dst_node.index.set_first_id(dst_node.index.first_id() +
                (src_node.is_leaf() ? prim_offsets[i] : node_offsets[i]));
        };

        // Make the leaves of the top BVH point to the right internal nodes
        for (auto& node : bvh.nodes) {
            if (!node.is_leaf())
                continue;
            assert(node.index.prim_count() == 1);
            size_t tree_id = bvh.prim_ids[node.index.first_id()];
            copy_node(tree_id, node, mini_trees[tree_id].get_root());
        }

        bvh.nodes.resize(node_count);
        bvh.prim_ids.resize(prim_count);
        executor_.for_each(0, mini_trees.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& mini_tree = mini_trees[i];

                    // Copy the nodes of the mini tree with the offsets applied, without copying
                    // the root node (since it is already copied to the top-level part of the BVH).
                    for (size_t j = 1; j < mini_tree.nodes.size(); ++j)
                        copy_node(i, bvh.nodes[node_offsets[i] + j], mini_tree.nodes[j]);

                    std::copy(
                        mini_tree.prim_ids.begin(),
                        mini_tree.prim_ids.end(),
                        bvh.prim_ids.begin() + prim_offsets[i]);
                }
            });

        return bvh;
    }